

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q4_K_ref(float *x,block_q4_K *y,int64_t k)

{
  float *pfVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  float fVar9;
  undefined1 auVar10 [16];
  int l;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint uVar15;
  float *pfVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  int j;
  long lVar22;
  bool bVar23;
  float fVar24;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar25 [16];
  uint uVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar30;
  uint uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar34;
  uint uVar36;
  float fVar37;
  undefined1 auVar35 [16];
  short sVar38;
  float fVar39;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar46;
  uint uVar48;
  undefined1 auVar47 [16];
  float scales [8];
  float mins [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar40;
  undefined6 uVar41;
  
  lVar22 = k + 0xff;
  if (-1 < k) {
    lVar22 = k;
  }
  uVar11 = (uint)((ulong)lVar22 >> 8);
  if (0 < (int)uVar11) {
    puVar17 = y->scales + 4;
    uVar21 = 0;
    do {
      auVar25 = ZEXT816(0);
      lVar22 = 0;
      pfVar16 = x;
      do {
        fVar24 = 0.0;
        lVar12 = 0;
        do {
          fVar24 = fVar24 + pfVar16[lVar12] * pfVar16[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x20);
        fVar24 = fVar24 * 0.03125;
        if (fVar24 < 0.0) {
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        lVar12 = 0;
        do {
          pfVar1 = pfVar16 + lVar12;
          fVar37 = *pfVar1;
          fVar39 = pfVar1[1];
          fVar45 = pfVar1[2];
          fVar9 = pfVar1[3];
          weights[lVar12] = ABS(fVar37) + fVar24;
          weights[lVar12 + 1] = ABS(fVar39) + fVar24;
          weights[lVar12 + 2] = ABS(fVar45) + fVar24;
          weights[lVar12 + 3] = ABS(fVar9) + fVar24;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x20);
        auVar27._0_4_ =
             make_qkx2_quants(0x20,0xf,x + lVar22 * 0x20,weights,L + lVar22 * 0x20,mins + lVar22,
                              Laux,-1.0,ABS(fVar37) + fVar24,0x14,false);
        auVar10 = _DAT_0014e7e0;
        auVar28 = _DAT_0014e730;
        scales[lVar22] = auVar27._0_4_;
        auVar27._4_4_ = mins[lVar22];
        auVar27._8_4_ = extraout_XMM0_Db;
        auVar27._12_4_ = 0;
        auVar25 = maxps(auVar27,auVar25);
        lVar22 = lVar22 + 1;
        pfVar16 = pfVar16 + 0x20;
      } while (lVar22 != 8);
      uVar13 = 0;
      uVar46 = (uint)DAT_0014a020;
      uVar48 = DAT_0014a020._4_4_;
      do {
        fVar24 = scales[uVar13] *
                 (float)(-(uint)(0.0 < auVar25._0_4_) & (uint)(63.0 / auVar25._0_4_)) + 12582912.0;
        bVar19 = SUB41(fVar24,0);
        if (0x3e < ((uint)fVar24 & 0xff)) {
          bVar19 = 0x3f;
        }
        uVar15 = (uint)(mins[uVar13] *
                        (float)(-(uint)(0.0 < auVar25._4_4_) & (uint)(63.0 / auVar25._4_4_)) +
                       12582912.0) & 0xff;
        if (0x3e < uVar15) {
          uVar15 = 0x3f;
        }
        if (uVar13 < 4) {
          puVar17[uVar13 - 4] = bVar19;
          puVar17[uVar13] = (byte)uVar15;
        }
        else {
          puVar17[uVar13] = (byte)(uVar15 << 4) | bVar19 & 0xf;
          puVar17[uVar13 - 8] = puVar17[uVar13 - 8] | (bVar19 & 0x30) << 2;
          puVar17[uVar13 - 4] = puVar17[uVar13 - 4] | ((byte)uVar15 & 0x30) << 2;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 8);
      auVar25 = divps(auVar25,_DAT_0014e7d0);
      uVar15 = auVar25._0_4_;
      uVar29 = auVar25._4_4_;
      uVar30 = uVar15 * 2 ^ 0x80000000;
      uVar33 = uVar29 * 2 ^ 0x80000000;
      uVar34 = -(uint)(-0xf000001 < (int)uVar30);
      uVar36 = -(uint)(-0xf000001 < (int)uVar33);
      fVar24 = (float)(~uVar34 & 0x40000000 |
                      SUB164(auVar25 & _DAT_0014e610,0) + 0x7800000U & uVar34) +
               (float)(uVar15 & uVar46) * 5.192297e+33 * 7.70372e-34;
      fVar37 = (float)(~uVar36 & 0x40000000 |
                      SUB164(auVar25 & _DAT_0014e610,4) + 0x7800000U & uVar36) +
               (float)(uVar29 & uVar48) * 5.192297e+33 * 7.70372e-34;
      auVar35._0_4_ = ((uint)fVar24 & 0xfff) + ((uint)fVar24 >> 0xd & 0x7c00);
      auVar35._4_4_ = ((uint)fVar37 & 0xfff) + ((uint)fVar37 >> 0xd & 0x7c00);
      auVar35._8_8_ = 0;
      auVar31._0_4_ = -(uint)(0x7f000000 < (int)uVar30);
      auVar31._4_4_ = -(uint)(0x7f000000 < (int)uVar33);
      auVar31._8_4_ = -(uint)(0 < (int)(auVar25._8_4_ * 2 ^ 0x80000000));
      auVar31._12_4_ = -(uint)(0 < (int)(auVar25._12_4_ * 2 ^ 0x80000000));
      auVar26._0_4_ = uVar15 >> 0x10;
      auVar26._4_4_ = uVar29 >> 0x10;
      auVar26._8_4_ = auVar25._8_4_ >> 0x10;
      auVar26._12_4_ = auVar25._12_4_ >> 0x10;
      auVar31 = auVar31 & _DAT_0014e680 | auVar26 & _DAT_0014e660 | ~auVar31 & auVar35;
      auVar27 = pshuflw(auVar26 & _DAT_0014e660,auVar31,0xe8);
      y[uVar21].field_0.dm = auVar27._0_4_;
      auVar25 = _DAT_0014e5d0;
      fVar24 = ggml_table_f32_f16[auVar27._0_4_ & 0xffff];
      puVar18 = L;
      uVar13 = 0;
      pfVar16 = x;
      do {
        if (uVar13 < 4) {
          bVar20 = y[uVar21].scales[uVar13] & 0x3f;
          bVar19 = y[uVar21].scales[uVar13 + 4] & 0x3f;
        }
        else {
          bVar20 = y[uVar21].scales[uVar13 - 4] >> 2 & 0x30 | y[uVar21].scales[uVar13 + 4] & 0xf;
          bVar19 = y[uVar21].scales[uVar13] >> 2 & 0x30 | y[uVar21].scales[uVar13 + 4] >> 4;
        }
        auVar32._0_4_ = (float)bVar20 * fVar24;
        if ((auVar32._0_4_ != 0.0) || (NAN(auVar32._0_4_))) {
          fVar37 = (float)bVar19 * ggml_table_f32_f16[auVar31._4_4_];
          auVar32._4_4_ = auVar32._0_4_;
          auVar32._8_4_ = auVar32._0_4_;
          auVar32._12_4_ = auVar32._0_4_;
          lVar22 = 0;
          do {
            pfVar1 = pfVar16 + lVar22;
            auVar42._0_4_ = *pfVar1 + fVar37;
            auVar42._4_4_ = pfVar1[1] + fVar37;
            auVar42._8_4_ = pfVar1[2] + fVar37;
            auVar42._12_4_ = pfVar1[3] + fVar37;
            auVar27 = divps(auVar42,auVar32);
            fVar39 = auVar27._0_4_ + 12582912.0;
            fVar45 = auVar27._4_4_ + 12582912.0;
            auVar43._0_8_ = CONCAT44(fVar45,fVar39) & 0x7fffff007fffff;
            auVar43._8_4_ = (uint)(auVar27._8_4_ + 12582912.0) & 0x7fffff;
            auVar43._12_4_ = (uint)(auVar27._12_4_ + 12582912.0) & 0x7fffff;
            auVar47._0_4_ = -(uint)((int)((uint)fVar39 & 0x7fffff) < auVar10._0_4_);
            auVar47._4_4_ = -(uint)((int)((uint)fVar45 & 0x7fffff) < auVar10._4_4_);
            auVar47._8_4_ = -(uint)((int)auVar43._8_4_ < auVar10._8_4_);
            auVar47._12_4_ = -(uint)((int)auVar43._12_4_ < auVar10._12_4_);
            auVar27 = ~auVar47 & auVar10 | auVar43 & auVar47;
            auVar44._0_4_ = -(uint)(0x400000 < auVar27._0_4_);
            auVar44._4_4_ = -(uint)(0x400000 < auVar27._4_4_);
            auVar44._8_4_ = -(uint)(0x400000 < auVar27._8_4_);
            auVar44._12_4_ = -(uint)(0x400000 < auVar27._12_4_);
            auVar27 = auVar44 & auVar27 & auVar28;
            sVar6 = auVar27._0_2_;
            cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar27[0] - (0xff < sVar6);
            sVar6 = auVar27._2_2_;
            sVar38 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar27[2] - (0xff < sVar6),cVar2);
            sVar6 = auVar27._4_2_;
            cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6);
            sVar6 = auVar27._6_2_;
            uVar40 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar27[6] - (0xff < sVar6),
                              CONCAT12(cVar3,sVar38));
            sVar6 = auVar27._8_2_;
            cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar27[8] - (0xff < sVar6);
            sVar6 = auVar27._10_2_;
            uVar41 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar27[10] - (0xff < sVar6),
                              CONCAT14(cVar4,uVar40));
            sVar6 = auVar27._12_2_;
            cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar27[0xc] - (0xff < sVar6);
            sVar8 = auVar27._14_2_;
            sVar6 = (short)((uint)uVar40 >> 0x10);
            sVar7 = (short)((uint6)uVar41 >> 0x20);
            sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xe] - (0xff < sVar8),
                                     CONCAT16(cVar5,uVar41)) >> 0x30);
            *(uint *)(puVar18 + lVar22) =
                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                            (0 < sVar38) * (sVar38 < 0x100) * cVar2 -
                                            (0xff < sVar38))));
            lVar22 = lVar22 + 4;
          } while (lVar22 != 0x20);
        }
        uVar13 = uVar13 + 1;
        puVar18 = puVar18 + 0x20;
        pfVar16 = pfVar16 + 0x20;
      } while (uVar13 != 8);
      puVar14 = y[uVar21].qs;
      puVar18 = L + 0x20;
      uVar13 = 0;
      do {
        lVar22 = 0;
        do {
          auVar28 = psllw(*(undefined1 (*) [16])(puVar18 + lVar22),4);
          *(undefined1 (*) [16])(puVar14 + lVar22) =
               auVar28 & auVar25 | *(undefined1 (*) [16])(puVar18 + lVar22 + -0x20);
          lVar22 = lVar22 + 0x10;
        } while (lVar22 != 0x20);
        puVar14 = puVar14 + 0x20;
        puVar18 = puVar18 + 0x40;
        bVar23 = uVar13 < 0xc0;
        uVar13 = uVar13 + 0x40;
      } while (bVar23);
      x = x + 0x100;
      uVar21 = uVar21 + 1;
      puVar17 = puVar17 + 0x90;
    } while (uVar21 != (uVar11 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q4_K_ref(const float * GGML_RESTRICT x, block_q4_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[32];
    float   weights[32];
    float mins[QK_K/32];
    float scales[QK_K/32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 15, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 15, x + 32*j, weights, L + 32*j, &mins[j], Laux, -1.f, 0.1f, 20, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(15, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * q = y[i].qs;
        for (int j = 0; j < QK_K; j += 64) {
            for (int l = 0; l < 32; ++l) q[l] = L[j + l] | (L[j + l + 32] << 4);
            q += 32;
        }

        x += QK_K;
    }
}